

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::generate_parameters(SystemVerilogCodeGen *this,Generator *generator)

{
  int64_t value_00;
  bool bVar1;
  char cVar2;
  uint32_t width;
  ParamType PVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *this_00;
  ostream *poVar4;
  reference __in;
  type *args;
  __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar5;
  _Storage<long,_true> args_00;
  long *plVar6;
  bool *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Enum *pEVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  ulong uVar11;
  size_type sVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  optional<long> oVar13;
  undefined1 auVar14 [16];
  basic_string_view<char> bVar15;
  string_view __str;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string local_668;
  string_view local_648;
  byte local_632;
  allocator<char> local_631;
  undefined1 local_630 [8];
  string param_str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  string local_550;
  undefined1 local_530 [8];
  Const c;
  long value;
  _Storage<long,_true> local_268;
  undefined1 local_260;
  string local_258 [8];
  string type_str;
  string value_str;
  type *param;
  type *name;
  _Self local_200;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *__range2;
  uint32_t count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *params;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1c0;
  basic_string_view<char> local_1b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_188;
  undefined1 *local_180;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_178;
  basic_string_view<char> local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_120) [8];
  char *local_118;
  string *local_110;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_108;
  basic_string_view<char> local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  type *local_a0;
  char (*local_98) [14];
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  this_00 = Generator::get_params_abi_cxx11_(generator);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
          ::empty(this_00);
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"#(");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar4,cVar2);
    this->indent_ = this->indent_ + 1;
    __range2._4_4_ = 0;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
             ::begin(this_00);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
         ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,&local_200);
      if (!bVar1) break;
      __in = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
             ::operator*(&__end2);
      args = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Param>>(__in);
      this_01 = (__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Param>>(__in);
      std::__cxx11::string::string((string *)(type_str.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_258);
      peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      oVar13 = Param::get_initial_value(peVar5);
      args_00._M_value =
           oVar13.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_260 = oVar13.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged;
      local_268._M_value = args_00._M_value;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_268);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        oVar13 = Param::get_initial_value(peVar5);
        c._664_8_ = oVar13.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_payload;
        plVar6 = std::optional<long>::operator*((optional<long> *)&c.num_bits_);
        value_00 = *plVar6;
        peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        width = (*(peVar5->super_Const).super_Var.super_IRNode._vptr_IRNode[7])();
        peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        pbVar7 = Var::is_signed((Var *)peVar5);
        args_00._0_4_ = *pbVar7 & 1;
        args_00._M_value._4_4_ = 0;
        Const::Const((Const *)local_530,value_00,width,SUB41(args_00._0_4_,0));
        Const::to_string_abi_cxx11_(&local_550,(Const *)local_530);
        std::__cxx11::string::operator=
                  ((string *)(type_str.field_2._M_local_buf + 8),(string *)&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        Const::~Const((Const *)local_530);
      }
      else {
        peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        PVar3 = Param::param_type(peVar5);
        if (PVar3 == RawType) {
          std::__cxx11::string::operator=(local_258,"type");
          peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          Param::get_raw_str_value_abi_cxx11_(&local_578,peVar5);
          bVar1 = std::optional::operator_cast_to_bool((optional *)&local_578);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_578);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_01);
            Param::get_raw_str_value_abi_cxx11_(&local_5a0,peVar5);
            pbVar8 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_5a0);
            std::__cxx11::string::operator=
                      ((string *)(type_str.field_2._M_local_buf + 8),(string *)pbVar8);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional(&local_5a0);
          }
          peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          Param::get_raw_str_initial_value_abi_cxx11_(&local_5c8,peVar5);
          bVar1 = std::optional::operator_cast_to_bool((optional *)&local_5c8);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_5c8);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_01);
            Param::get_raw_str_initial_value_abi_cxx11_(&local_5f0,peVar5);
            pbVar8 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_5f0);
            std::__cxx11::string::operator=
                      ((string *)(type_str.field_2._M_local_buf + 8),(string *)pbVar8);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional(&local_5f0);
          }
        }
        else {
          peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          PVar3 = Param::param_type(peVar5);
          if (PVar3 == Enum) {
            peVar5 = std::
                     __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_01);
            pEVar9 = Param::enum_def(peVar5);
            std::__cxx11::string::operator=(local_258,(string *)&pEVar9->name);
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_01);
            PVar3 = Param::param_type(peVar5);
            if (PVar3 != Parameter) {
              peVar5 = std::
                       __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->(this_01);
              bVar1 = Param::has_value(peVar5);
              if (bVar1) {
                peVar5 = std::
                         __shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(this_01);
                Param::value_str_abi_cxx11_((string *)((long)&param_str.field_2 + 8),peVar5);
                std::__cxx11::string::operator=
                          ((string *)(type_str.field_2._M_local_buf + 8),
                           (string *)(param_str.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(param_str.field_2._M_local_buf + 8));
              }
            }
          }
        }
      }
      auVar14 = std::__cxx11::string::empty();
      local_632 = 0;
      if ((auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_180 = local_630;
        local_188 = "parameter {0}";
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_258;
        local_1a8.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string&,char[14],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"parameter {0}",(v7 *)vargs,auVar14._8_8_,
                        (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_00);
        local_198 = &local_1a8;
        bVar15 = fmt::v7::to_string_view<char,_0>(local_188);
        local_78 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_80 = local_198;
        local_70 = local_198;
        local_60 = local_198;
        local_68 = local_78;
        local_1b8 = bVar15;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_78,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_198->string);
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_1c0.values_;
        format_str.size_ = (size_t)this_local;
        format_str.data_ = (char *)local_1b8.size_;
        in_R8 = local_1c0;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_630,(detail *)local_1b8.data_,format_str,args_01);
      }
      else {
        std::allocator<char>::allocator();
        local_632 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_630,"parameter",&local_631);
      }
      if ((local_632 & 1) != 0) {
        std::allocator<char>::~allocator(&local_631);
      }
      __str = indent(this);
      local_648 = __str;
      pbVar10 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                &(this->stream_).super_stringstream.field_0x10,__str);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        local_88 = &local_668;
        local_90 = "{0} {1} = {2}";
        local_98 = (char (*) [14])local_630;
        vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&type_str.field_2 + 8);
        local_a0 = args;
        fmt::v7::
        make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,char[14],char>
                  (&local_e8,(v7 *)"{0} {1} = {2}",local_98,args,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_2,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
        local_b0 = &local_e8;
        bVar15 = fmt::v7::to_string_view<char,_0>(local_90);
        local_28 = &local_108;
        local_30 = local_b0;
        local_20 = local_b0;
        local_10 = local_b0;
        local_18 = local_28;
        local_f8 = bVar15;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xddd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_b0);
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_108.field_1.values_;
        format_str_01.size_ = local_108.desc_;
        format_str_01.data_ = (char *)local_f8.size_;
        in_R8 = local_108.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_668,(detail *)local_f8.data_,format_str_01,args_03);
      }
      else {
        local_110 = &local_668;
        local_118 = "{0} {1}";
        local_120 = (char (*) [8])local_630;
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)args;
        fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[8],char>
                  (&local_158,(v7 *)"{0} {1}",local_120,args,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)in_R8.values_);
        local_130 = &local_158;
        bVar15 = fmt::v7::to_string_view<char,_0>(local_118);
        local_50 = &local_178;
        local_58 = local_130;
        local_48 = local_130;
        local_38 = local_130;
        local_40 = local_50;
        local_168 = bVar15;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_50,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_130);
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_178.field_1.values_;
        format_str_00.size_ = local_178.desc_;
        format_str_00.data_ = (char *)local_168.size_;
        in_R8 = local_178.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_668,(detail *)local_168.data_,format_str_00,args_02);
      }
      std::operator<<(pbVar10,(string *)&local_668);
      std::__cxx11::string::~string((string *)&local_668);
      __range2._4_4_ = __range2._4_4_ + 1;
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               ::size(this_00);
      if (__range2._4_4_ < sVar12) {
        std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,",");
      }
      cVar2 = Stream::endl(&this->stream_);
      std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,cVar2);
      std::__cxx11::string::~string((string *)local_630);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string((string *)(type_str.field_2._M_local_buf + 8));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
      ::operator++(&__end2);
    }
    poVar4 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,")");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar4,cVar2);
    this->indent_ = this->indent_ - 1;
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_parameters(Generator* generator) {
    const auto& params = generator->get_params();
    if (!params.empty()) {
        stream_ << "#(" << stream_.endl();
        indent_++;
        uint32_t count = 0;
        for (auto const& [name, param] : params) {
            std::string value_str, type_str;
            if (param->get_initial_value()) {
                auto value = *param->get_initial_value();
                auto c = Const(value, param->width(), param->is_signed());
                value_str = c.to_string();
            } else if (param->param_type() == ParamType::RawType) {
                type_str = "type";
                // determine the initial values
                if (param->get_raw_str_value()) {
                    value_str = *param->get_raw_str_value();
                }
                if (param->get_raw_str_initial_value()) {
                    // use the initial lvalue instead since it's user's intention
                    value_str = *param->get_raw_str_initial_value();
                }
            } else if (param->param_type() == ParamType::Enum) {
                type_str = param->enum_def()->name;
            } else if (param->param_type() != ParamType::Parameter) {
                if (param->has_value()) value_str = param->value_str();
            }
            std::string param_str =
                type_str.empty() ? "parameter" : ::format("parameter {0}", type_str);
            stream_ << indent()
                    << (value_str.empty() ? ::format("{0} {1}", param_str, name)
                                          : ::format("{0} {1} = {2}", param_str, name, value_str));
            if (++count < params.size()) {
                stream_ << ",";
            }
            stream_ << stream_.endl();
        }
        stream_ << ")" << stream_.endl();
        indent_--;
    }
}